

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O3

void Abc_NtkTransferOrder(Abc_Ntk_t *pNtkOld,Abc_Ntk_t *pNtkNew)

{
  long *plVar1;
  int iVar2;
  Abc_Nam_t *p;
  Abc_Nam_t *p_00;
  char *pcVar3;
  long lVar4;
  Vec_Ptr_t *pVVar5;
  ulong uVar6;
  
  p = Abc_NtkNameMan(pNtkOld,0);
  p_00 = Abc_NtkNameMan(pNtkOld,1);
  if (pNtkOld->vPis->nSize != pNtkNew->vPis->nSize) {
    __assert_fail("Abc_NtkPiNum(pNtkOld) == Abc_NtkPiNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcNames.c"
                  ,0x19e,"void Abc_NtkTransferOrder(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtkOld->vPos->nSize != pNtkNew->vPos->nSize) {
    __assert_fail("Abc_NtkPoNum(pNtkOld) == Abc_NtkPoNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcNames.c"
                  ,0x19f,"void Abc_NtkTransferOrder(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtkOld->nObjCounts[8] != pNtkNew->nObjCounts[8]) {
    __assert_fail("Abc_NtkLatchNum(pNtkOld) == Abc_NtkLatchNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcNames.c"
                  ,0x1a0,"void Abc_NtkTransferOrder(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  pVVar5 = pNtkNew->vCis;
  if (0 < pVVar5->nSize) {
    uVar6 = 0;
    do {
      plVar1 = (long *)pVVar5->pArray[uVar6];
      pcVar3 = Nm_ManCreateUniqueName(*(Nm_Man_t **)(*plVar1 + 0x18),(int)plVar1[2]);
      iVar2 = Abc_NamStrFind(p,pcVar3);
      *(int *)(plVar1 + 8) = iVar2;
      if (iVar2 < 1) {
LAB_0081ce2b:
        __assert_fail("pObj->iTemp > 0 && pObj->iTemp <= Abc_NtkCiNum(pNtkNew)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcNames.c"
                      ,0x1a5,"void Abc_NtkTransferOrder(Abc_Ntk_t *, Abc_Ntk_t *)");
      }
      pVVar5 = pNtkNew->vCis;
      if (pVVar5->nSize < iVar2) goto LAB_0081ce2b;
      uVar6 = uVar6 + 1;
    } while (uVar6 < (uint)pVVar5->nSize);
  }
  pVVar5 = pNtkNew->vCos;
  if (0 < pVVar5->nSize) {
    uVar6 = 0;
    do {
      plVar1 = (long *)pVVar5->pArray[uVar6];
      pcVar3 = Nm_ManCreateUniqueName(*(Nm_Man_t **)(*plVar1 + 0x18),(int)plVar1[2]);
      iVar2 = Abc_NamStrFind(p_00,pcVar3);
      *(int *)(plVar1 + 8) = iVar2;
      if (iVar2 < 1) {
LAB_0081ce4a:
        __assert_fail("pObj->iTemp > 0 && pObj->iTemp <= Abc_NtkCoNum(pNtkNew)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcNames.c"
                      ,0x1aa,"void Abc_NtkTransferOrder(Abc_Ntk_t *, Abc_Ntk_t *)");
      }
      pVVar5 = pNtkNew->vCos;
      if (pVVar5->nSize < iVar2) goto LAB_0081ce4a;
      uVar6 = uVar6 + 1;
    } while (uVar6 < (uint)pVVar5->nSize);
  }
  Abc_NamDeref(p);
  Abc_NamDeref(p_00);
  qsort(pNtkNew->vPis->pArray,(long)pNtkNew->vPis->nSize,8,Abc_NodeCompareIndexes);
  qsort(pNtkNew->vPos->pArray,(long)pNtkNew->vPos->nSize,8,Abc_NodeCompareIndexes);
  qsort(pNtkNew->vCis->pArray,(long)pNtkNew->vCis->nSize,8,Abc_NodeCompareIndexes);
  qsort(pNtkNew->vCos->pArray,(long)pNtkNew->vCos->nSize,8,Abc_NodeCompareIndexes);
  pVVar5 = pNtkNew->vCis;
  if (0 < pVVar5->nSize) {
    lVar4 = 0;
    do {
      *(undefined4 *)((long)pVVar5->pArray[lVar4] + 0x40) = 0;
      lVar4 = lVar4 + 1;
      pVVar5 = pNtkNew->vCis;
    } while (lVar4 < pVVar5->nSize);
  }
  pVVar5 = pNtkNew->vCos;
  if (0 < pVVar5->nSize) {
    lVar4 = 0;
    do {
      *(undefined4 *)((long)pVVar5->pArray[lVar4] + 0x40) = 0;
      lVar4 = lVar4 + 1;
      pVVar5 = pNtkNew->vCos;
    } while (lVar4 < pVVar5->nSize);
  }
  return;
}

Assistant:

void Abc_NtkTransferOrder( Abc_Ntk_t * pNtkOld, Abc_Ntk_t * pNtkNew )
{
    Abc_Obj_t * pObj;  int i;
    Abc_Nam_t * pStrsCi = Abc_NtkNameMan( pNtkOld, 0 );
    Abc_Nam_t * pStrsCo = Abc_NtkNameMan( pNtkOld, 1 );
    assert( Abc_NtkPiNum(pNtkOld) == Abc_NtkPiNum(pNtkNew) );
    assert( Abc_NtkPoNum(pNtkOld) == Abc_NtkPoNum(pNtkNew) );
    assert( Abc_NtkLatchNum(pNtkOld) == Abc_NtkLatchNum(pNtkNew) );
    // transfer to the new network
    Abc_NtkForEachCi( pNtkNew, pObj, i )
    {
        pObj->iTemp = Abc_NamStrFind(pStrsCi, Abc_ObjName(pObj));
        assert( pObj->iTemp > 0 && pObj->iTemp <= Abc_NtkCiNum(pNtkNew) );
    }
    Abc_NtkForEachCo( pNtkNew, pObj, i )
    {
        pObj->iTemp = Abc_NamStrFind(pStrsCo, Abc_ObjName(pObj));
        assert( pObj->iTemp > 0 && pObj->iTemp <= Abc_NtkCoNum(pNtkNew) );
    }
    Abc_NamDeref( pStrsCi );
    Abc_NamDeref( pStrsCo );
    // order PI/PO 
    qsort( (void *)Vec_PtrArray(pNtkNew->vPis), (size_t)Vec_PtrSize(pNtkNew->vPis), sizeof(Abc_Obj_t *), 
        (int (*)(const void *, const void *)) Abc_NodeCompareIndexes );
    qsort( (void *)Vec_PtrArray(pNtkNew->vPos), (size_t)Vec_PtrSize(pNtkNew->vPos), sizeof(Abc_Obj_t *), 
        (int (*)(const void *, const void *)) Abc_NodeCompareIndexes );
    // order CI/CO 
    qsort( (void *)Vec_PtrArray(pNtkNew->vCis), (size_t)Vec_PtrSize(pNtkNew->vCis), sizeof(Abc_Obj_t *), 
        (int (*)(const void *, const void *)) Abc_NodeCompareIndexes );
    qsort( (void *)Vec_PtrArray(pNtkNew->vCos), (size_t)Vec_PtrSize(pNtkNew->vCos), sizeof(Abc_Obj_t *), 
        (int (*)(const void *, const void *)) Abc_NodeCompareIndexes );
    // order CIs/COs first PIs/POs(Asserts) then latches
    //Abc_NtkOrderCisCos( pNtk );
    // clean the copy fields
    Abc_NtkForEachCi( pNtkNew, pObj, i )
        pObj->iTemp = 0;
    Abc_NtkForEachCo( pNtkNew, pObj, i )
        pObj->iTemp = 0;
}